

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaVector.cpp
# Opt level: O0

void __thiscall NaVector::link_data(NaVector *this,NaVector *rVect)

{
  long in_RSI;
  long in_RDI;
  
  if (((*(byte *)(in_RDI + 8) & 1) != 0) && (*(void **)(in_RDI + 0x10) != (void *)0x0)) {
    operator_delete__(*(void **)(in_RDI + 0x10));
  }
  *(undefined1 *)(in_RDI + 8) = 0;
  *(undefined4 *)(in_RDI + 0xc) = *(undefined4 *)(in_RSI + 0xc);
  *(undefined8 *)(in_RDI + 0x10) = *(undefined8 *)(in_RSI + 0x10);
  return;
}

Assistant:

void
NaVector::link_data (NaVector& rVect)
{
    if(bOwnStorage){
        delete[] pVect;
    }
    bOwnStorage = false;
    nDim = rVect.nDim;
    pVect = rVect.pVect;
}